

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void print_expr_struct_debug(lyxp_expr *exp)

{
  char *pcVar1;
  size_t sVar2;
  char local_98 [8];
  char tmp [128];
  uint16_t j;
  uint16_t i;
  lyxp_expr *exp_local;
  
  if ((exp != (lyxp_expr *)0x0) && (2 < ly_log_level)) {
    ly_log_dbg(8,"expression \"%s\":",exp->expr);
    tmp[0x7e] = '\0';
    tmp[0x7f] = '\0';
    for (; (ushort)tmp._126_2_ < exp->used; tmp._126_2_ = tmp._126_2_ + 1) {
      pcVar1 = print_token(exp->tokens[(ushort)tmp._126_2_]);
      sprintf(local_98,"\ttoken %s, in expression \"%.*s\"",pcVar1,
              (ulong)exp->tok_len[(ushort)tmp._126_2_],
              exp->expr + exp->expr_pos[(ushort)tmp._126_2_]);
      if (exp->repeat[(ushort)tmp._126_2_] != (lyxp_expr_type *)0x0) {
        sVar2 = strlen(local_98);
        sprintf(local_98 + sVar2," (repeat %d",(ulong)*exp->repeat[(ushort)tmp._126_2_]);
        tmp[0x7c] = '\x01';
        tmp[0x7d] = '\0';
        for (; exp->repeat[(ushort)tmp._126_2_][(ushort)tmp._124_2_] != LYXP_EXPR_NONE;
            tmp._124_2_ = tmp._124_2_ + 1) {
          sVar2 = strlen(local_98);
          sprintf(local_98 + sVar2,", %d",
                  (ulong)exp->repeat[(ushort)tmp._126_2_][(ushort)tmp._124_2_]);
        }
        strcat(local_98,")");
      }
      ly_log_dbg(8,local_98);
    }
  }
  return;
}

Assistant:

static void
print_expr_struct_debug(struct lyxp_expr *exp)
{
    uint16_t i, j;
    char tmp[128];

    if (!exp || (ly_log_level < LY_LLDBG)) {
        return;
    }

    LOGDBG(LY_LDGXPATH, "expression \"%s\":", exp->expr);
    for (i = 0; i < exp->used; ++i) {
        sprintf(tmp, "\ttoken %s, in expression \"%.*s\"", print_token(exp->tokens[i]), exp->tok_len[i],
               &exp->expr[exp->expr_pos[i]]);
        if (exp->repeat[i]) {
            sprintf(tmp + strlen(tmp), " (repeat %d", exp->repeat[i][0]);
            for (j = 1; exp->repeat[i][j]; ++j) {
                sprintf(tmp + strlen(tmp), ", %d", exp->repeat[i][j]);
            }
            strcat(tmp, ")");
        }
        LOGDBG(LY_LDGXPATH, tmp);
    }
}